

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O2

Polynomial * getCharacteristicPolynomial(RationalNum **matrix,uint size)

{
  int iVar1;
  Polynomial *pPVar2;
  RationalNum *pRVar3;
  uint i;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  RationalNum local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows;
  
  if (matrix == (RationalNum **)0x0) {
    pPVar2 = (Polynomial *)0x0;
  }
  else {
    pPVar2 = (Polynomial *)operator_new(0x10);
    pPVar2->degree = size;
    uVar6 = (ulong)(size + 1) << 4;
    pRVar3 = (RationalNum *)operator_new__(uVar6);
    if (size != 0xffffffff) {
      uVar7 = 0;
      do {
        RationalNum::RationalNum((RationalNum *)((long)&pRVar3->numerator + uVar7));
        uVar7 = uVar7 + 0x10;
      } while (uVar6 != uVar7);
    }
    pPVar2->coefficients = pRVar3;
    for (uVar4 = 0; dVar8 = exp2((double)size), (double)uVar4 < dVar8; uVar4 = uVar4 + 1) {
      rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar1 = 0;
      uVar5 = 1;
      while( true ) {
        local_78.numerator._0_4_ = iVar1;
        dVar8 = exp2((double)(size + 1));
        if (dVar8 <= (double)uVar5) break;
        if ((uVar5 & uVar4) != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                     (value_type_conflict3 *)&local_78);
        }
        uVar5 = uVar5 * 2;
        iVar1 = (int)local_78.numerator + 1;
      }
      local_78 = getMainMinor(matrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &rows.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             );
      RationalNum::operator+=
                (pRVar3 + ((ulong)size -
                          ((ulong)((long)rows.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)rows.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2)),&local_78)
      ;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    for (uVar4 = 1; uVar4 <= size; uVar4 = uVar4 + 2) {
      RationalNum::RationalNum((RationalNum *)&rows,-1,1);
      RationalNum::operator*=(pRVar3 + uVar4,(RationalNum *)&rows);
    }
  }
  return pPVar2;
}

Assistant:

Polynomial* getCharacteristicPolynomial(RationalNum** matrix, unsigned int size) {
    if(matrix == nullptr) return nullptr;

    Polynomial* polynomial = new Polynomial;
    polynomial->degree = size;
    polynomial->coefficients = new RationalNum [polynomial->degree + 1];

    for(unsigned int i = 0; i < pow(2, size); i++) {
        vector<unsigned int>rows;
        for(unsigned int j = 1, p = 0; j < pow(2, size + 1); j *= 2, p++) {
            if((i & j) != 0) rows.push_back(p);
        }
        polynomial->coefficients[size - rows.size()] += getMainMinor(matrix, rows);
    }
    for(unsigned int i = 1; i <= polynomial->degree; i += 2) polynomial->coefficients[i] *= -1ll;

    return polynomial;
}